

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::isUnresolved(QPDF *this,QPDFObjGen og)

{
  bool bVar1;
  pointer pMVar2;
  mapped_type *this_00;
  element_type *this_01;
  bool local_21;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  this_local = (QPDF *)og;
  bVar1 = isCached(this,og);
  local_21 = true;
  if (bVar1) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::
              map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::operator[](&pMVar2->obj_cache,(key_type *)&this_local);
    this_01 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this_00);
    local_21 = QPDFObject::isUnresolved(this_01);
  }
  return local_21;
}

Assistant:

bool
QPDF::isUnresolved(QPDFObjGen og)
{
    return !isCached(og) || m->obj_cache[og].object->isUnresolved();
}